

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::SPxSolverBase<double>::getDualSol(SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  double dVar1;
  bool bVar2;
  Status SVar3;
  Representation RVar4;
  int iVar5;
  undefined8 uVar6;
  double *pdVar7;
  VectorBase<double> *in_RSI;
  SPxSolverBase<double> *in_RDI;
  int i_1;
  Desc *ds;
  int i;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  SPxLPBase<double> *in_stack_ffffffffffffff40;
  Status in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  VectorBase<double> *in_stack_ffffffffffffff50;
  int local_7c;
  DataKey local_6c;
  SPxRowId local_64;
  DataKey local_5c;
  int local_54;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  VectorBase<double> *local_18;
  Status local_4;
  
  local_18 = in_RSI;
  bVar2 = isInitialized(in_RDI);
  if (bVar2) {
    RVar4 = rep(in_RDI);
    if (RVar4 == ROW) {
      SPxLPBase<double>::maxRowObj((SPxLPBase<double> *)0x215d30);
      VectorBase<double>::operator=
                ((VectorBase<double> *)in_stack_ffffffffffffff40,
                 (VectorBase<double> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                );
      local_54 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x215d4a);
      while (local_54 = local_54 + -1, -1 < local_54) {
        local_5c = (DataKey)SPxBasisBase<double>::baseId
                                      ((SPxBasisBase<double> *)
                                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                                       ,0);
        bVar2 = SPxId::isSPxRowId((SPxId *)&local_5c);
        if (bVar2) {
          fVec(in_RDI);
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffff3c);
          dVar1 = *pdVar7;
          in_stack_ffffffffffffff50 = local_18;
          local_6c = (DataKey)SPxBasisBase<double>::baseId
                                        ((SPxBasisBase<double> *)
                                         CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38),0);
          SPxRowId::SPxRowId(&local_64,(SPxId *)&local_6c);
          SPxLPBase<double>::number
                    (in_stack_ffffffffffffff40,
                     (SPxRowId *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffff3c);
          *pdVar7 = dVar1;
        }
      }
    }
    else {
      SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
      local_7c = 0;
      while (in_stack_ffffffffffffff4c = local_7c,
            iVar5 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x215e48),
            in_stack_ffffffffffffff4c < iVar5) {
        in_stack_ffffffffffffff48 =
             SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        if (((((uint)(in_stack_ffffffffffffff48 + P_FREE) < 2) ||
             (in_stack_ffffffffffffff48 == D_ON_LOWER)) || (in_stack_ffffffffffffff48 == D_ON_BOTH))
           || (in_stack_ffffffffffffff48 == D_UNDEFINED)) {
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffff3c);
          *pdVar7 = 0.0;
        }
        else {
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffff3c);
          in_stack_ffffffffffffff40 = (SPxLPBase<double> *)*pdVar7;
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffff3c);
          *pdVar7 = (double)in_stack_ffffffffffffff40;
        }
        local_7c = local_7c + 1;
      }
    }
    SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
    VectorBase<double>::operator*=
              (in_stack_ffffffffffffff50,
               (double *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_4 = status((SPxSolverBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  else {
    SVar3 = status((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (SVar3 != NO_PROBLEM) {
      local_4d = 1;
      uVar6 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"XSOLVE08 No Problem loaded",&local_39);
      SPxStatusException::SPxStatusException
                ((SPxStatusException *)in_stack_ffffffffffffff40,
                 (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_4d = 0;
      __cxa_throw(uVar6,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
    }
    local_4 = status((SPxSolverBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  return local_4;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getDualSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE08 No Problem loaded");
   }

   if(rep() == ROW)
   {
      int i;
      p_vector = this->maxRowObj();

      for(i = this->nCols() - 1; i >= 0; --i)
      {
         if(this->baseId(i).isSPxRowId())
            p_vector[ this->number(SPxRowId(this->baseId(i))) ] = fVec()[i];
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nRows(); ++i)
      {
         switch(ds.rowStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = (*theCoPvec)[i];
         }
      }
   }

   p_vector *= Real(this->spxSense());

   return status();
}